

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_resampler.cpp
# Opt level: O1

void __thiscall
crnlib::threaded_resampler::resample_y_task(threaded_resampler *this,uint64 data,void *param_2)

{
  Contrib_List *pCVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ushort uVar6;
  uint min_new_capacity;
  uint uVar7;
  pixel_format pVar8;
  uint uVar9;
  params *ppVar10;
  Contrib_List *pCVar11;
  vec<4U,_float> *pvVar12;
  Contrib *pCVar13;
  void *pvVar14;
  vec<4U,_float> *pvVar15;
  int iVar16;
  ulong uVar17;
  uint *puVar18;
  ulong uVar19;
  long lVar20;
  vec<4U,_float> *pvVar21;
  uint i;
  ulong uVar22;
  vec<4U,_float> *pvVar23;
  ulong uVar24;
  uint uVar25;
  float fVar26;
  vector<crnlib::vec<4U,_float>_> tmp;
  vec<4U,_float> result;
  elemental_vector local_68;
  ulong local_50;
  ulong local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  min_new_capacity = this->m_pParams->m_dst_width;
  local_68.m_p = (vec<4U,_float> *)0x0;
  local_68.m_size = 0;
  local_68.m_capacity = 0;
  if (min_new_capacity != 0) {
    elemental_vector::increase_capacity
              (&local_68,min_new_capacity,min_new_capacity == 1,0x10,(object_mover)0x0,false);
    local_68.m_size = min_new_capacity;
  }
  ppVar10 = this->m_pParams;
  uVar22 = (ulong)ppVar10->m_dst_height;
  if (uVar22 != 0) {
    pCVar11 = this->m_pY_contribs;
    uVar7 = this->m_pTask_pool->m_num_threads;
    local_50 = (ulong)uVar7;
    pvVar12 = (this->m_tmp_img).m_p;
    uVar17 = 0;
    do {
      iVar16 = (int)uVar17;
      if ((uVar7 == 0) || ((int)((uVar17 & 0xffffffff) % (ulong)(uVar7 + 1)) == (int)data)) {
        pCVar1 = pCVar11 + uVar17;
        if (pCVar11[uVar17].n == 1) {
          pvVar15 = pvVar12 + (uint)pCVar1->p->pixel * ppVar10->m_dst_width;
        }
        else {
          uVar6 = pCVar1->n;
          pvVar15 = (vec<4U,_float> *)local_68.m_p;
          if ((ulong)uVar6 != 0) {
            uVar9 = ppVar10->m_dst_width;
            pCVar13 = pCVar1->p;
            uVar24 = 0;
            do {
              pvVar21 = pvVar12 + pCVar13[uVar24].pixel * uVar9;
              fVar3 = pCVar13[uVar24].weight;
              if (uVar24 == 0) {
                uVar25 = ppVar10->m_dst_width;
                if ((ulong)uVar25 != 0) {
                  uVar19 = 0;
                  do {
                    lVar20 = 0;
                    do {
                      *(float *)((long)&local_40 + lVar20 * 4) = pvVar21->m_s[lVar20] * fVar3;
                      lVar20 = lVar20 + 1;
                    } while (lVar20 != 4);
                    *(undefined8 *)((vec<4U,_float> *)((long)local_68.m_p + uVar19 * 0x10))->m_s =
                         local_40;
                    *(undefined8 *)
                     (((vec<4U,_float> *)((long)local_68.m_p + uVar19 * 0x10))->m_s + 2) = uStack_38
                    ;
                    uVar19 = uVar19 + 1;
                    pvVar21 = pvVar21 + 1;
                  } while (uVar19 != uVar25);
                }
              }
              else if ((ulong)uVar9 != 0) {
                uVar19 = 0;
                pvVar23 = (vec<4U,_float> *)local_68.m_p;
                do {
                  lVar20 = 0;
                  do {
                    *(float *)((long)&local_40 + lVar20 * 4) = pvVar21->m_s[lVar20] * fVar3;
                    lVar20 = lVar20 + 1;
                  } while (lVar20 != 4);
                  lVar20 = 0;
                  do {
                    pvVar23->m_s[lVar20] =
                         *(float *)((long)&local_40 + lVar20 * 4) + pvVar23->m_s[lVar20];
                    lVar20 = lVar20 + 1;
                  } while (lVar20 != 4);
                  uVar19 = uVar19 + 1;
                  pvVar21 = pvVar21 + 1;
                  pvVar23 = pvVar23 + 1;
                } while (uVar19 != uVar9);
              }
              uVar24 = uVar24 + 1;
            } while (uVar24 != uVar6);
          }
        }
        pVar8 = ppVar10->m_fmt;
        uVar9 = ppVar10->m_dst_width;
        fVar3 = ppVar10->m_sample_low;
        fVar4 = ppVar10->m_sample_high;
        if (pVar8 == cPF_RGBA_F32) {
          uVar25 = ppVar10->m_dst_pitch * iVar16;
          pvVar14 = ppVar10->m_pDst_pixels;
          lVar20 = 0;
          do {
            pfVar2 = (float *)((long)pvVar15->m_s + lVar20);
            fVar5 = *pfVar2;
            fVar26 = fVar4;
            if (fVar5 <= fVar4) {
              fVar26 = fVar5;
            }
            *(uint *)((long)pvVar14 + lVar20 + (ulong)uVar25) =
                 -(uint)(fVar5 < fVar3) & (uint)fVar3 | ~-(uint)(fVar5 < fVar3) & (uint)fVar26;
            fVar5 = pfVar2[1];
            fVar26 = fVar4;
            if (fVar5 <= fVar4) {
              fVar26 = fVar5;
            }
            *(uint *)((long)pvVar14 + lVar20 + (ulong)uVar25 + 4) =
                 -(uint)(fVar5 < fVar3) & (uint)fVar3 | ~-(uint)(fVar5 < fVar3) & (uint)fVar26;
            fVar5 = pfVar2[2];
            fVar26 = fVar4;
            if (fVar5 <= fVar4) {
              fVar26 = fVar5;
            }
            *(uint *)((long)pvVar14 + lVar20 + (ulong)uVar25 + 8) =
                 -(uint)(fVar5 < fVar3) & (uint)fVar3 | ~-(uint)(fVar5 < fVar3) & (uint)fVar26;
            fVar5 = pfVar2[3];
            fVar26 = fVar4;
            if (fVar5 <= fVar4) {
              fVar26 = fVar5;
            }
            *(uint *)((long)pvVar14 + lVar20 + (ulong)uVar25 + 0xc) =
                 -(uint)(fVar5 < fVar3) & (uint)fVar3 | ~-(uint)(fVar5 < fVar3) & (uint)fVar26;
            lVar20 = lVar20 + 0x10;
          } while ((vec<4U,_float> *)(pfVar2 + 4) != pvVar15 + uVar9);
        }
        else if (pVar8 == cPF_RGBX_F32) {
          uVar25 = ppVar10->m_dst_pitch * iVar16;
          pvVar14 = ppVar10->m_pDst_pixels;
          lVar20 = 0;
          do {
            pfVar2 = (float *)((long)pvVar15->m_s + lVar20);
            fVar5 = *pfVar2;
            fVar26 = fVar4;
            if (fVar5 <= fVar4) {
              fVar26 = fVar5;
            }
            *(uint *)((long)pvVar14 + lVar20 + (ulong)uVar25) =
                 -(uint)(fVar5 < fVar3) & (uint)fVar3 | ~-(uint)(fVar5 < fVar3) & (uint)fVar26;
            fVar5 = pfVar2[1];
            fVar26 = fVar4;
            if (fVar5 <= fVar4) {
              fVar26 = fVar5;
            }
            *(uint *)((long)pvVar14 + lVar20 + (ulong)uVar25 + 4) =
                 -(uint)(fVar5 < fVar3) & (uint)fVar3 | ~-(uint)(fVar5 < fVar3) & (uint)fVar26;
            fVar5 = pfVar2[2];
            fVar26 = fVar4;
            if (fVar5 <= fVar4) {
              fVar26 = fVar5;
            }
            *(uint *)((long)pvVar14 + lVar20 + (ulong)uVar25 + 8) =
                 -(uint)(fVar5 < fVar3) & (uint)fVar3 | ~-(uint)(fVar5 < fVar3) & (uint)fVar26;
            *(float *)((long)pvVar14 + lVar20 + (ulong)uVar25 + 0xc) = fVar4;
            lVar20 = lVar20 + 0x10;
          } while ((vec<4U,_float> *)(pfVar2 + 4) != pvVar15 + uVar9);
        }
        else if (pVar8 == cPF_Y_F32) {
          puVar18 = (uint *)((ulong)(ppVar10->m_dst_pitch * iVar16) + (long)ppVar10->m_pDst_pixels);
          lVar20 = 0;
          do {
            fVar5 = *(float *)((long)pvVar15->m_s + lVar20);
            fVar26 = fVar4;
            if (fVar5 <= fVar4) {
              fVar26 = fVar5;
            }
            *puVar18 = -(uint)(fVar5 < fVar3) & (uint)fVar3 | ~-(uint)(fVar5 < fVar3) & (uint)fVar26
            ;
            puVar18 = puVar18 + 1;
            lVar20 = lVar20 + 0x10;
          } while ((ulong)uVar9 * 0x10 != lVar20);
        }
      }
      uVar17 = uVar17 + 1;
      local_48 = uVar22;
    } while (uVar17 != uVar22);
  }
  if ((vec<4U,_float> *)local_68.m_p != (vec<4U,_float> *)0x0) {
    crnlib_free(local_68.m_p);
  }
  return;
}

Assistant:

void threaded_resampler::resample_y_task(uint64 data, void*)
    {
        const uint thread_index = (uint)data;

        crnlib::vector<vec4F> tmp(m_pParams->m_dst_width);

        for (uint dst_y = 0; dst_y < m_pParams->m_dst_height; dst_y++)
        {
            if (m_pTask_pool->get_num_threads())
            {
                if ((dst_y % (m_pTask_pool->get_num_threads() + 1)) != thread_index)
                {
                    continue;
                }
            }

            const Resampler::Contrib_List& contribs = m_pY_contribs[dst_y];

            const vec4F* pSrc;

            if (contribs.n == 1)
            {
                pSrc = m_tmp_img.get_ptr() + m_pParams->m_dst_width * contribs.p[0].pixel;
            }
            else
            {
                for (uint src_y_iter = 0; src_y_iter < contribs.n; src_y_iter++)
                {
                    const vec4F* p = m_tmp_img.get_ptr() + m_pParams->m_dst_width * contribs.p[src_y_iter].pixel;
                    const float weight = contribs.p[src_y_iter].weight;

                    if (!src_y_iter)
                    {
                        for (uint i = 0; i < m_pParams->m_dst_width; i++)
                        {
                            tmp[i] = p[i] * weight;
                        }
                    }
                    else
                    {
                        for (uint i = 0; i < m_pParams->m_dst_width; i++)
                        {
                            tmp[i] += p[i] * weight;
                        }
                    }
                }

                pSrc = tmp.get_ptr();
            }

            const vec4F* pSrc_end = pSrc + m_pParams->m_dst_width;

            const float l = m_pParams->m_sample_low;
            const float h = m_pParams->m_sample_high;

            switch (m_pParams->m_fmt)
            {
            case cPF_Y_F32:
            {
                float* pDst = reinterpret_cast<float*>(static_cast<uint8*>(m_pParams->m_pDst_pixels) + m_pParams->m_dst_pitch * dst_y);

                do
                {
                    *pDst++ = math::clamp((*pSrc)[0], l, h);

                    pSrc++;
                } while (pSrc != pSrc_end);

                break;
            }
            case cPF_RGBX_F32:
            {
                vec4F* pDst = reinterpret_cast<vec4F*>(static_cast<uint8*>(m_pParams->m_pDst_pixels) + m_pParams->m_dst_pitch * dst_y);

                do
                {
                    (*pDst)[0] = math::clamp((*pSrc)[0], l, h);
                    (*pDst)[1] = math::clamp((*pSrc)[1], l, h);
                    (*pDst)[2] = math::clamp((*pSrc)[2], l, h);
                    (*pDst)[3] = h;

                    pSrc++;
                    pDst++;
                } while (pSrc != pSrc_end);

                break;
            }
            case cPF_RGBA_F32:
            {
                vec4F* pDst = reinterpret_cast<vec4F*>(static_cast<uint8*>(m_pParams->m_pDst_pixels) + m_pParams->m_dst_pitch * dst_y);

                do
                {
                    (*pDst)[0] = math::clamp((*pSrc)[0], l, h);
                    (*pDst)[1] = math::clamp((*pSrc)[1], l, h);
                    (*pDst)[2] = math::clamp((*pSrc)[2], l, h);
                    (*pDst)[3] = math::clamp((*pSrc)[3], l, h);

                    pSrc++;
                    pDst++;
                } while (pSrc != pSrc_end);

                break;
            }
            default:
                break;
            }
        }
    }